

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *
CoreML::sizeRangesOf
          (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
           *__return_storage_ptr__,ImageFeatureType *params)

{
  ImageFeatureType_ImageSizeRange *pIVar1;
  SizeRange *pSVar2;
  int64 local_70;
  uint64 local_68;
  pair<long,_long> local_60;
  int64 local_50 [3];
  uint64 local_38;
  pair<long,_long> local_30;
  undefined1 local_19;
  ImageFeatureType *local_18;
  ImageFeatureType *params_local;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *ranges;
  
  local_19 = 0;
  local_18 = params;
  params_local = (ImageFeatureType *)__return_storage_ptr__;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            (__return_storage_ptr__);
  pIVar1 = Specification::ImageFeatureType::imagesizerange(local_18);
  pSVar2 = Specification::ImageFeatureType_ImageSizeRange::widthrange(pIVar1);
  local_38 = Specification::SizeRange::lowerbound(pSVar2);
  pIVar1 = Specification::ImageFeatureType::imagesizerange(local_18);
  pSVar2 = Specification::ImageFeatureType_ImageSizeRange::widthrange(pIVar1);
  local_50[0] = Specification::SizeRange::upperbound(pSVar2);
  local_30 = std::make_pair<long,long>((long *)&local_38,local_50);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::push_back
            (__return_storage_ptr__,&local_30);
  pIVar1 = Specification::ImageFeatureType::imagesizerange(local_18);
  pSVar2 = Specification::ImageFeatureType_ImageSizeRange::heightrange(pIVar1);
  local_68 = Specification::SizeRange::lowerbound(pSVar2);
  pIVar1 = Specification::ImageFeatureType::imagesizerange(local_18);
  pSVar2 = Specification::ImageFeatureType_ImageSizeRange::heightrange(pIVar1);
  local_70 = Specification::SizeRange::upperbound(pSVar2);
  local_60 = std::make_pair<long,long>((long *)&local_68,&local_70);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::push_back
            (__return_storage_ptr__,&local_60);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::pair<int64_t,int64_t>> sizeRangesOf(const Specification::ImageFeatureType &params) {
        std::vector<std::pair<int64_t,int64_t>> ranges;

        ranges.push_back(std::make_pair((int64_t)params.imagesizerange().widthrange().lowerbound(),
                                        (int64_t)params.imagesizerange().widthrange().upperbound()));
        ranges.push_back(std::make_pair((int64_t)params.imagesizerange().heightrange().lowerbound(),
                                        (int64_t)params.imagesizerange().heightrange().upperbound()));
        return ranges;
    }